

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int * __thiscall
JsUtil::
BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateBuckets(BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,uint bucketCount)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  HeapAllocator *this_00;
  undefined4 *puVar4;
  int *piVar5;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&int::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_136c13;
  data.filename._0_4_ = 0x447;
  data.plusSize = (ulong)bucketCount;
  this_00 = Memory::HeapAllocator::TrackAllocInfo(this->alloc,(TrackAllocData *)local_48);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00934d65;
    *puVar4 = 0;
  }
  piVar5 = (int *)Memory::HeapAllocator::AllocT<false>(this_00,(ulong)bucketCount << 2);
  if (piVar5 == (int *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00934d65:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return piVar5;
}

Assistant:

int *AllocateBuckets(DECLSPEC_GUARD_OVERFLOW const uint bucketCount)
        {
            return
                AllocateArray<AllocatorType, int, false>(
                    TRACK_ALLOC_INFO(alloc, int, AllocatorType, 0, bucketCount),
                    TypeAllocatorFunc<AllocatorType, int>::GetAllocFunc(),
                    bucketCount);
        }